

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__decode_jpeg_header(stbi__jpeg *z,int scan)

{
  stbi_uc sVar1;
  int iVar2;
  int in_ESI;
  long in_RDI;
  int m;
  int in_stack_00000064;
  stbi__jpeg *in_stack_00000068;
  stbi__jpeg *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  undefined1 uVar3;
  int local_4;
  
  *(undefined4 *)(in_RDI + 0x4848) = 0;
  *(undefined4 *)(in_RDI + 0x484c) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x4828) = 0xff;
  sVar1 = stbi__get_marker(in_stack_ffffffffffffffd8);
  if (sVar1 == 0xd8) {
    if (in_ESI == 1) {
      local_4 = 1;
    }
    else {
      sVar1 = stbi__get_marker(in_stack_ffffffffffffffd8);
      while( true ) {
        uVar3 = true;
        if ((sVar1 != 0xc0) && (uVar3 = true, sVar1 != 0xc1)) {
          uVar3 = sVar1 == 0xc2;
        }
        if (((uVar3 ^ 0xff) & 1) == 0) {
          *(uint *)(in_RDI + 0x4830) = (uint)(sVar1 == 0xc2);
          iVar2 = stbi__process_frame_header(z,scan);
          if (iVar2 == 0) {
            return 0;
          }
          return 1;
        }
        iVar2 = stbi__process_marker(in_stack_00000068,in_stack_00000064);
        if (iVar2 == 0) break;
        sVar1 = stbi__get_marker(in_stack_ffffffffffffffd8);
        while (sVar1 == 0xff) {
          iVar2 = stbi__at_eof((stbi__context *)in_stack_ffffffffffffffd8);
          if (iVar2 != 0) {
            iVar2 = stbi__err((char *)CONCAT17(uVar3,in_stack_ffffffffffffffe0));
            return iVar2;
          }
          sVar1 = stbi__get_marker(in_stack_ffffffffffffffd8);
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = stbi__err((char *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  }
  return local_4;
}

Assistant:

static int stbi__decode_jpeg_header(stbi__jpeg *z, int scan)
{
   int m;
   z->jfif = 0;
   z->app14_color_transform = -1; // valid values are 0,1,2
   z->marker = STBI__MARKER_none; // initialize cached marker to empty
   m = stbi__get_marker(z);
   if (!stbi__SOI(m)) return stbi__err("no SOI","Corrupt JPEG");
   if (scan == STBI__SCAN_type) return 1;
   m = stbi__get_marker(z);
   while (!stbi__SOF(m)) {
      if (!stbi__process_marker(z,m)) return 0;
      m = stbi__get_marker(z);
      while (m == STBI__MARKER_none) {
         // some files have extra padding after their blocks, so ok, we'll scan
         if (stbi__at_eof(z->s)) return stbi__err("no SOF", "Corrupt JPEG");
         m = stbi__get_marker(z);
      }
   }
   z->progressive = stbi__SOF_progressive(m);
   if (!stbi__process_frame_header(z, scan)) return 0;
   return 1;
}